

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

void vocinialo(voccxdef *ctx,vocddef **what,int cnt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vocddef *pvVar9;
  long lVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  int iVar33;
  undefined1 auVar32 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar36 [16];
  
  pvVar9 = (vocddef *)mchalo(ctx->voccxerr,(long)cnt << 5,"vocinialo");
  *what = pvVar9;
  auVar8 = _DAT_002cd480;
  auVar7 = _DAT_002cd470;
  auVar6 = _DAT_002cbbf0;
  auVar5 = _DAT_002cbbe0;
  auVar4 = _DAT_002cbbd0;
  if (cnt != 0) {
    lVar10 = (ulong)(uint)cnt - 1;
    auVar12._8_4_ = (int)lVar10;
    auVar12._0_8_ = lVar10;
    auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
    pvVar9 = pvVar9 + 7;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_002cbbf0;
    do {
      auVar24._8_4_ = (int)uVar11;
      auVar24._0_8_ = uVar11;
      auVar24._12_4_ = (int)(uVar11 >> 0x20);
      auVar16 = (auVar24 | auVar5) ^ auVar6;
      iVar25 = auVar12._0_4_;
      iVar31 = -(uint)(iVar25 < auVar16._0_4_);
      iVar13 = auVar12._4_4_;
      auVar17._4_4_ = -(uint)(iVar13 < auVar16._4_4_);
      iVar30 = auVar12._8_4_;
      iVar33 = -(uint)(iVar30 < auVar16._8_4_);
      iVar14 = auVar12._12_4_;
      auVar17._12_4_ = -(uint)(iVar14 < auVar16._12_4_);
      auVar27._4_4_ = iVar31;
      auVar27._0_4_ = iVar31;
      auVar27._8_4_ = iVar33;
      auVar27._12_4_ = iVar33;
      auVar34 = pshuflw(in_XMM11,auVar27,0xe8);
      auVar19._4_4_ = -(uint)(auVar16._4_4_ == iVar13);
      auVar19._12_4_ = -(uint)(auVar16._12_4_ == iVar14);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar36 = pshuflw(in_XMM12,auVar19,0xe8);
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      auVar35 = pshuflw(auVar34,auVar17,0xe8);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar35 | auVar36 & auVar34) ^ auVar16;
      auVar16 = packssdw(auVar16,auVar16);
      if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pvVar9[-7].vocdfn = 0xffff;
      }
      auVar17 = auVar19 & auVar27 | auVar17;
      auVar16 = packssdw(auVar17,auVar17);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar35,auVar16 ^ auVar35);
      if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
        pvVar9[-6].vocdfn = 0xffff;
      }
      auVar16 = (auVar24 | auVar4) ^ auVar6;
      iVar31 = -(uint)(iVar25 < auVar16._0_4_);
      auVar32._4_4_ = -(uint)(iVar13 < auVar16._4_4_);
      iVar33 = -(uint)(iVar30 < auVar16._8_4_);
      auVar32._12_4_ = -(uint)(iVar14 < auVar16._12_4_);
      auVar18._4_4_ = iVar31;
      auVar18._0_4_ = iVar31;
      auVar18._8_4_ = iVar33;
      auVar18._12_4_ = iVar33;
      auVar26._4_4_ = -(uint)(auVar16._4_4_ == iVar13);
      auVar26._12_4_ = -(uint)(auVar16._12_4_ == iVar14);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar16 = auVar26 & auVar18 | auVar32;
      auVar16 = packssdw(auVar16,auVar16);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar1,auVar16 ^ auVar1);
      if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pvVar9[-5].vocdfn = 0xffff;
      }
      auVar19 = pshufhw(auVar18,auVar18,0x84);
      auVar27 = pshufhw(auVar26,auVar26,0x84);
      auVar17 = pshufhw(auVar19,auVar32,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar17 | auVar27 & auVar19) ^ auVar20;
      auVar19 = packssdw(auVar20,auVar20);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pvVar9[-4].vocdfn = 0xffff;
      }
      auVar19 = (auVar24 | auVar8) ^ auVar6;
      iVar31 = -(uint)(iVar25 < auVar19._0_4_);
      auVar22._4_4_ = -(uint)(iVar13 < auVar19._4_4_);
      iVar33 = -(uint)(iVar30 < auVar19._8_4_);
      auVar22._12_4_ = -(uint)(iVar14 < auVar19._12_4_);
      auVar28._4_4_ = iVar31;
      auVar28._0_4_ = iVar31;
      auVar28._8_4_ = iVar33;
      auVar28._12_4_ = iVar33;
      auVar16 = pshuflw(auVar16,auVar28,0xe8);
      auVar21._4_4_ = -(uint)(auVar19._4_4_ == iVar13);
      auVar21._12_4_ = -(uint)(auVar19._12_4_ == iVar14);
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      in_XMM12 = pshuflw(auVar36 & auVar34,auVar21,0xe8);
      in_XMM12 = in_XMM12 & auVar16;
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar16 = pshuflw(auVar16,auVar22,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar16 | in_XMM12) ^ auVar34;
      in_XMM11 = packssdw(auVar34,auVar34);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pvVar9[-3].vocdfn = 0xffff;
      }
      auVar22 = auVar21 & auVar28 | auVar22;
      auVar16 = packssdw(auVar22,auVar22);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar36,auVar16 ^ auVar36);
      if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pvVar9[-2].vocdfn = 0xffff;
      }
      auVar16 = (auVar24 | auVar7) ^ auVar6;
      iVar25 = -(uint)(iVar25 < auVar16._0_4_);
      auVar29._4_4_ = -(uint)(iVar13 < auVar16._4_4_);
      iVar30 = -(uint)(iVar30 < auVar16._8_4_);
      auVar29._12_4_ = -(uint)(iVar14 < auVar16._12_4_);
      auVar23._4_4_ = iVar25;
      auVar23._0_4_ = iVar25;
      auVar23._8_4_ = iVar30;
      auVar23._12_4_ = iVar30;
      auVar15._4_4_ = -(uint)(auVar16._4_4_ == iVar13);
      auVar15._12_4_ = -(uint)(auVar16._12_4_ == iVar14);
      auVar15._0_4_ = auVar15._4_4_;
      auVar15._8_4_ = auVar15._12_4_;
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar16 = auVar15 & auVar23 | auVar29;
      auVar16 = packssdw(auVar16,auVar16);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar2,auVar16 ^ auVar2);
      if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pvVar9[-1].vocdfn = 0xffff;
      }
      auVar24 = pshufhw(auVar23,auVar23,0x84);
      auVar16 = pshufhw(auVar15,auVar15,0x84);
      auVar19 = pshufhw(auVar24,auVar29,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 & auVar24,(auVar19 | auVar16 & auVar24) ^ auVar3);
      if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pvVar9->vocdfn = 0xffff;
      }
      uVar11 = uVar11 + 8;
      pvVar9 = pvVar9 + 8;
    } while (((ulong)(uint)cnt + 7 & 0xfffffffffffffff8) != uVar11);
  }
  return;
}

Assistant:

void vocinialo(voccxdef *ctx, vocddef **what, int cnt)
{
    vocddef *p;
    
    *what = (vocddef *)mchalo(ctx->voccxerr,
                              (cnt * sizeof(vocddef)), "vocinialo");

    /* set all object/function entries to MCMONINV to indicate not-in-use */
    for (p = *what ; cnt ; ++p, --cnt)
        p->vocdfn = MCMONINV;
}